

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles2::Functional::eval_selection_ivec2(ShaderEvalContext *c)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(c->in[2].m_data + 1);
  uVar1 = (uint)(0.0 < c->in[0].m_data[2]);
  auVar4._0_8_ = CONCAT44((int)(uVar1 << 0x1f) >> 0x1f,(int)(uVar1 << 0x1f) >> 0x1f);
  auVar4._8_8_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)c->in[1].m_data & auVar4._0_8_;
  auVar2 = ~auVar4 & auVar3 | auVar2;
  *(ulong *)((c->color).m_data + 1) = CONCAT44((float)(int)auVar2._0_4_,(float)(int)auVar2._4_4_);
  return;
}

Assistant:

void eval_selection_ivec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 0).asInt(),			c.in[2].swizzle(2, 1).asInt()).asFloat(); }